

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_eor_16_pd(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  uint res;
  uint ea;
  
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 2;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = address;
  uVar2 = m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7];
  uVar1 = m68ki_read_16_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  uVar2 = (uVar2 ^ uVar1) & 0xffff;
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,uVar2);
  m68ki_cpu.n_flag = uVar2 >> 8;
  m68ki_cpu.not_z_flag = uVar2;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_eor_16_pd(void)
{
	uint ea = EA_AY_PD_16();
	uint res = MASK_OUT_ABOVE_16(DX ^ m68ki_read_16(ea));

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}